

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Sigmoid_x86_avx512::forward_inplace(Sigmoid_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 (*pauVar18) [64];
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar25 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar37;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar30 [32];
  
  iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar31 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar32 = vxorps_avx512dq(auVar31,(undefined1  [64])_ps512_cephes_exp_C1);
  auVar31 = vxorps_avx512dq(auVar31,(undefined1  [64])_ps512_cephes_exp_C2);
  uVar21 = 0;
  uVar20 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar20 = uVar21;
  }
  for (; uVar21 != uVar20; uVar21 = uVar21 + 1) {
    pauVar18 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar21 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar19 = 0; iVar19 + 0xf < iVar17; iVar19 = iVar19 + 0x10) {
      auVar33 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar33 = vxorps_avx512dq(auVar33,*pauVar18);
      auVar33 = vminps_avx512f(auVar33,(undefined1  [64])_ps512_exp_hi);
      auVar33 = vmaxps_avx512f(auVar33,(undefined1  [64])_ps512_exp_lo);
      auVar34 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_LOG2EF,auVar33,
                                    (undefined1  [64])_ps512_cephes_exp_p5);
      auVar35 = vrndscaleps_avx512f(auVar34,1);
      uVar2 = vcmpps_avx512f(auVar34,auVar35,1);
      auVar34 = vsubps_avx512f(auVar35,(undefined1  [64])_ps512_1);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar36._0_4_ = (uint)bVar1 * auVar34._0_4_ | (uint)!bVar1 * auVar35._0_4_;
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar1 * auVar34._4_4_ | (uint)!bVar1 * auVar35._4_4_;
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar1 * auVar34._8_4_ | (uint)!bVar1 * auVar35._8_4_;
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar1 * auVar34._12_4_ | (uint)!bVar1 * auVar35._12_4_;
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar1 * auVar34._16_4_ | (uint)!bVar1 * auVar35._16_4_;
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar1 * auVar34._20_4_ | (uint)!bVar1 * auVar35._20_4_;
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar1 * auVar34._24_4_ | (uint)!bVar1 * auVar35._24_4_;
      bVar1 = (bool)((byte)(uVar2 >> 7) & 1);
      auVar36._28_4_ = (uint)bVar1 * auVar34._28_4_ | (uint)!bVar1 * auVar35._28_4_;
      bVar1 = (bool)((byte)(uVar2 >> 8) & 1);
      auVar36._32_4_ = (uint)bVar1 * auVar34._32_4_ | (uint)!bVar1 * auVar35._32_4_;
      bVar1 = (bool)((byte)(uVar2 >> 9) & 1);
      auVar36._36_4_ = (uint)bVar1 * auVar34._36_4_ | (uint)!bVar1 * auVar35._36_4_;
      bVar1 = (bool)((byte)(uVar2 >> 10) & 1);
      auVar36._40_4_ = (uint)bVar1 * auVar34._40_4_ | (uint)!bVar1 * auVar35._40_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xb) & 1);
      auVar36._44_4_ = (uint)bVar1 * auVar34._44_4_ | (uint)!bVar1 * auVar35._44_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xc) & 1);
      auVar36._48_4_ = (uint)bVar1 * auVar34._48_4_ | (uint)!bVar1 * auVar35._48_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xd) & 1);
      auVar36._52_4_ = (uint)bVar1 * auVar34._52_4_ | (uint)!bVar1 * auVar35._52_4_;
      bVar1 = (bool)((byte)(uVar2 >> 0xe) & 1);
      auVar36._56_4_ = (uint)bVar1 * auVar34._56_4_ | (uint)!bVar1 * auVar35._56_4_;
      bVar1 = SUB81(uVar2 >> 0xf,0);
      auVar36._60_4_ = (uint)bVar1 * auVar34._60_4_ | (uint)!bVar1 * auVar35._60_4_;
      auVar33 = vfmadd231ps_avx512f(auVar33,auVar36,auVar32);
      auVar33 = vfmadd231ps_avx512f(auVar33,auVar36,auVar31);
      auVar34 = vmulps_avx512f(auVar33,auVar33);
      auVar35 = vfmadd132ps_avx512f(auVar33,(undefined1  [64])_ps512_cephes_exp_p1,
                                    (undefined1  [64])_ps512_cephes_exp_p0);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])_ps512_cephes_exp_p2);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])_ps512_cephes_exp_p3);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])_ps512_cephes_exp_p4);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])_ps512_cephes_exp_p5);
      auVar33 = vfmadd213ps_avx512f(auVar35,auVar34,auVar33);
      auVar33 = vaddps_avx512f(auVar33,(undefined1  [64])_ps512_1);
      auVar34 = vcvttps2dq_avx512f(auVar36);
      auVar34 = vpaddd_avx512f(auVar34,(undefined1  [64])_pi32_512_0x7f);
      auVar34 = vpslld_avx512f(auVar34,0x17);
      auVar35 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar33 = vfmadd213ps_avx512f(auVar34,auVar33,auVar35);
      auVar34 = vrcp14ps_avx512f(auVar33);
      auVar33 = vfmsub213ps_avx512f(auVar33,auVar34,auVar35);
      auVar33 = vfnmadd132ps_avx512vl(auVar33,auVar34,auVar34);
      *pauVar18 = auVar33;
      pauVar18 = pauVar18 + 1;
    }
    for (; iVar19 + 7 < iVar17; iVar19 = iVar19 + 8) {
      auVar26 = *(undefined1 (*) [32])*pauVar18;
      auVar40._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar40._16_4_ = auVar26._16_4_ ^ 0x80000000;
      auVar40._20_4_ = auVar26._20_4_ ^ 0x80000000;
      auVar40._24_4_ = auVar26._24_4_ ^ 0x80000000;
      auVar40._28_4_ = auVar26._28_4_ ^ 0x80000000;
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar26._16_4_ = 0x42b0c0a5;
      auVar26._20_4_ = 0x42b0c0a5;
      auVar26._24_4_ = 0x42b0c0a5;
      auVar26._28_4_ = 0x42b0c0a5;
      auVar26 = vminps_avx512vl(auVar40,auVar26);
      auVar27._8_4_ = 0xc2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._12_4_ = 0xc2b0c0a5;
      auVar27._16_4_ = 0xc2b0c0a5;
      auVar27._20_4_ = 0xc2b0c0a5;
      auVar27._24_4_ = 0xc2b0c0a5;
      auVar27._28_4_ = 0xc2b0c0a5;
      auVar27 = vmaxps_avx512vl(auVar26,auVar27);
      auVar49._8_4_ = 0x3f000000;
      auVar49._0_8_ = 0x3f0000003f000000;
      auVar49._12_4_ = 0x3f000000;
      auVar49._16_4_ = 0x3f000000;
      auVar49._20_4_ = 0x3f000000;
      auVar49._24_4_ = 0x3f000000;
      auVar49._28_4_ = 0x3f000000;
      auVar28._8_4_ = 0x3fb8aa3b;
      auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar28._12_4_ = 0x3fb8aa3b;
      auVar28._16_4_ = 0x3fb8aa3b;
      auVar28._20_4_ = 0x3fb8aa3b;
      auVar28._24_4_ = 0x3fb8aa3b;
      auVar28._28_4_ = 0x3fb8aa3b;
      auVar28 = vfmadd231ps_avx512vl(auVar49,auVar27,auVar28);
      auVar26 = vroundps_avx(auVar28,1);
      uVar2 = vcmpps_avx512vl(auVar28,auVar26,1);
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar51._16_4_ = 0x3f800000;
      auVar51._20_4_ = 0x3f800000;
      auVar51._24_4_ = 0x3f800000;
      auVar51._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx512vl(auVar26,auVar51);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar30._0_4_ = (float)((uint)bVar1 * auVar29._0_4_ | (uint)!bVar1 * auVar26._0_4_);
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar30._4_4_ = (float)((uint)bVar1 * auVar29._4_4_ | (uint)!bVar1 * auVar26._4_4_);
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar30._8_4_ = (float)((uint)bVar1 * auVar29._8_4_ | (uint)!bVar1 * auVar26._8_4_);
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar30._12_4_ = (float)((uint)bVar1 * auVar29._12_4_ | (uint)!bVar1 * auVar26._12_4_);
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar30._16_4_ = (float)((uint)bVar1 * auVar29._16_4_ | (uint)!bVar1 * auVar26._16_4_);
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar30._20_4_ = (float)((uint)bVar1 * auVar29._20_4_ | (uint)!bVar1 * auVar26._20_4_);
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar30._24_4_ = (float)((uint)bVar1 * auVar29._24_4_ | (uint)!bVar1 * auVar26._24_4_);
      bVar1 = SUB81(uVar2 >> 7,0);
      auVar30._28_4_ = (float)((uint)bVar1 * auVar29._28_4_ | (uint)!bVar1 * auVar26._28_4_);
      auVar29._8_4_ = 0x3f318000;
      auVar29._0_8_ = 0x3f3180003f318000;
      auVar29._12_4_ = 0x3f318000;
      auVar29._16_4_ = 0x3f318000;
      auVar29._20_4_ = 0x3f318000;
      auVar29._24_4_ = 0x3f318000;
      auVar29._28_4_ = 0x3f318000;
      auVar26 = vfmsub231ps_avx512vl(auVar27,auVar30,auVar29);
      auVar10._8_4_ = 0x395e8083;
      auVar10._0_8_ = 0x395e8083395e8083;
      auVar10._12_4_ = 0x395e8083;
      auVar10._16_4_ = 0x395e8083;
      auVar10._20_4_ = 0x395e8083;
      auVar10._24_4_ = 0x395e8083;
      auVar10._28_4_ = 0x395e8083;
      auVar26 = vfmsub231ps_avx512vl(auVar26,auVar30,auVar10);
      auVar16._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar16._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar16._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar16._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar16._16_4_ = auVar26._16_4_ * auVar26._16_4_;
      auVar16._20_4_ = auVar26._20_4_ * auVar26._20_4_;
      auVar16._24_4_ = auVar26._24_4_ * auVar26._24_4_;
      auVar16._28_4_ = auVar28._28_4_;
      auVar47._8_4_ = 0x39506967;
      auVar47._0_8_ = 0x3950696739506967;
      auVar47._12_4_ = 0x39506967;
      auVar47._16_4_ = 0x39506967;
      auVar47._20_4_ = 0x39506967;
      auVar47._24_4_ = 0x39506967;
      auVar47._28_4_ = 0x39506967;
      auVar11._8_4_ = 0x3ab743ce;
      auVar11._0_8_ = 0x3ab743ce3ab743ce;
      auVar11._12_4_ = 0x3ab743ce;
      auVar11._16_4_ = 0x3ab743ce;
      auVar11._20_4_ = 0x3ab743ce;
      auVar11._24_4_ = 0x3ab743ce;
      auVar11._28_4_ = 0x3ab743ce;
      auVar27 = vfmadd213ps_avx512vl(auVar47,auVar26,auVar11);
      auVar12._8_4_ = 0x3c088908;
      auVar12._0_8_ = 0x3c0889083c088908;
      auVar12._12_4_ = 0x3c088908;
      auVar12._16_4_ = 0x3c088908;
      auVar12._20_4_ = 0x3c088908;
      auVar12._24_4_ = 0x3c088908;
      auVar12._28_4_ = 0x3c088908;
      auVar27 = vfmadd213ps_avx512vl(auVar27,auVar26,auVar12);
      auVar13._8_4_ = 0x3d2aa9c1;
      auVar13._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar13._12_4_ = 0x3d2aa9c1;
      auVar13._16_4_ = 0x3d2aa9c1;
      auVar13._20_4_ = 0x3d2aa9c1;
      auVar13._24_4_ = 0x3d2aa9c1;
      auVar13._28_4_ = 0x3d2aa9c1;
      auVar27 = vfmadd213ps_avx512vl(auVar27,auVar26,auVar13);
      auVar14._8_4_ = 0x3e2aaaaa;
      auVar14._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar14._12_4_ = 0x3e2aaaaa;
      auVar14._16_4_ = 0x3e2aaaaa;
      auVar14._20_4_ = 0x3e2aaaaa;
      auVar14._24_4_ = 0x3e2aaaaa;
      auVar14._28_4_ = 0x3e2aaaaa;
      auVar27 = vfmadd213ps_avx512vl(auVar27,auVar26,auVar14);
      auVar22 = vfmadd213ps_fma(auVar27,auVar26,auVar49);
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar16,auVar26);
      auVar41._0_4_ = auVar22._0_4_ + 1.0;
      auVar41._4_4_ = auVar22._4_4_ + 1.0;
      auVar41._8_4_ = auVar22._8_4_ + 1.0;
      auVar41._12_4_ = auVar22._12_4_ + 1.0;
      auVar41._16_4_ = 0x3f800000;
      auVar41._20_4_ = 0x3f800000;
      auVar41._24_4_ = 0x3f800000;
      auVar41._28_4_ = 0x3f800000;
      auVar44._0_4_ = (int)auVar30._0_4_;
      auVar44._4_4_ = (int)auVar30._4_4_;
      auVar44._8_4_ = (int)auVar30._8_4_;
      auVar44._12_4_ = (int)auVar30._12_4_;
      auVar44._16_4_ = (int)auVar30._16_4_;
      auVar44._20_4_ = (int)auVar30._20_4_;
      auVar44._24_4_ = (int)auVar30._24_4_;
      auVar44._28_4_ = (int)auVar30._28_4_;
      auVar26 = vpslld_avx2(auVar44,0x17);
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar15._16_4_ = 0x3f800000;
      auVar15._20_4_ = 0x3f800000;
      auVar15._24_4_ = 0x3f800000;
      auVar15._28_4_ = 0x3f800000;
      auVar26 = vpaddd_avx512vl(auVar26,auVar15);
      auVar22 = vfmadd213ps_fma(auVar26,auVar41,auVar51);
      auVar26 = vrcpps_avx(ZEXT1632(auVar22));
      auVar22 = vfmsub213ps_fma(ZEXT1632(auVar22),auVar26,auVar51);
      auVar22 = vfnmadd132ps_fma(ZEXT1632(auVar22),auVar26,auVar26);
      *(undefined1 (*) [32])*pauVar18 = ZEXT1632(auVar22);
      pauVar18 = (undefined1 (*) [64])(*pauVar18 + 0x20);
    }
    for (; iVar19 + 3 < iVar17; iVar19 = iVar19 + 4) {
      auVar38._0_8_ = *(ulong *)*pauVar18 ^ 0x8000000080000000;
      auVar38._8_4_ = *(uint *)(*pauVar18 + 8) ^ 0x80000000;
      auVar38._12_4_ = *(uint *)(*pauVar18 + 0xc) ^ 0x80000000;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx512vl(auVar38,auVar22);
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar23 = vmaxps_avx512vl(auVar22,auVar23);
      auVar48._8_4_ = 0x3f000000;
      auVar48._0_8_ = 0x3f0000003f000000;
      auVar48._12_4_ = 0x3f000000;
      auVar24._8_4_ = 0x3fb8aa3b;
      auVar24._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar24._12_4_ = 0x3fb8aa3b;
      auVar24 = vfmadd231ps_avx512vl(auVar48,auVar23,auVar24);
      auVar45._0_4_ = (int)auVar24._0_4_;
      auVar45._4_4_ = (int)auVar24._4_4_;
      auVar45._8_4_ = (int)auVar24._8_4_;
      auVar45._12_4_ = (int)auVar24._12_4_;
      auVar22 = vcvtdq2ps_avx(auVar45);
      uVar2 = vcmpps_avx512vl(auVar24,auVar22,1);
      auVar50._8_4_ = 0x3f800000;
      auVar50._0_8_ = 0x3f8000003f800000;
      auVar50._12_4_ = 0x3f800000;
      auVar24 = vsubps_avx512vl(auVar22,auVar50);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar25._0_4_ = (float)((uint)bVar1 * auVar24._0_4_ | (uint)!bVar1 * auVar22._0_4_);
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar25._4_4_ = (float)((uint)bVar1 * auVar24._4_4_ | (uint)!bVar1 * auVar22._4_4_);
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar25._8_4_ = (float)((uint)bVar1 * auVar24._8_4_ | (uint)!bVar1 * auVar22._8_4_);
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar25._12_4_ = (float)((uint)bVar1 * auVar24._12_4_ | (uint)!bVar1 * auVar22._12_4_);
      auVar3._8_4_ = 0x3f318000;
      auVar3._0_8_ = 0x3f3180003f318000;
      auVar3._12_4_ = 0x3f318000;
      auVar22 = vfmsub231ps_avx512vl(auVar23,auVar25,auVar3);
      auVar4._8_4_ = 0x395e8083;
      auVar4._0_8_ = 0x395e8083395e8083;
      auVar4._12_4_ = 0x395e8083;
      auVar23 = vfmsub231ps_avx512vl(auVar22,auVar25,auVar4);
      auVar42._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar42._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar42._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar42._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar46._8_4_ = 0x39506967;
      auVar46._0_8_ = 0x3950696739506967;
      auVar46._12_4_ = 0x39506967;
      auVar5._8_4_ = 0x3ab743ce;
      auVar5._0_8_ = 0x3ab743ce3ab743ce;
      auVar5._12_4_ = 0x3ab743ce;
      auVar22 = vfmadd213ps_avx512vl(auVar46,auVar23,auVar5);
      auVar6._8_4_ = 0x3c088908;
      auVar6._0_8_ = 0x3c0889083c088908;
      auVar6._12_4_ = 0x3c088908;
      auVar22 = vfmadd213ps_avx512vl(auVar22,auVar23,auVar6);
      auVar7._8_4_ = 0x3d2aa9c1;
      auVar7._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar7._12_4_ = 0x3d2aa9c1;
      auVar22 = vfmadd213ps_avx512vl(auVar22,auVar23,auVar7);
      auVar8._8_4_ = 0x3e2aaaaa;
      auVar8._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar8._12_4_ = 0x3e2aaaaa;
      auVar22 = vfmadd213ps_avx512vl(auVar22,auVar23,auVar8);
      auVar22 = vfmadd213ps_fma(auVar22,auVar23,auVar48);
      auVar22 = vfmadd213ps_fma(auVar22,auVar42,auVar23);
      auVar39._0_4_ = auVar22._0_4_ + 1.0;
      auVar39._4_4_ = auVar22._4_4_ + 1.0;
      auVar39._8_4_ = auVar22._8_4_ + 1.0;
      auVar39._12_4_ = auVar22._12_4_ + 1.0;
      auVar43._0_4_ = (int)auVar25._0_4_;
      auVar43._4_4_ = (int)auVar25._4_4_;
      auVar43._8_4_ = (int)auVar25._8_4_;
      auVar43._12_4_ = (int)auVar25._12_4_;
      auVar22 = vpslld_avx(auVar43,0x17);
      auVar9._8_4_ = 0x3f800000;
      auVar9._0_8_ = 0x3f8000003f800000;
      auVar9._12_4_ = 0x3f800000;
      auVar22 = vpaddd_avx512vl(auVar22,auVar9);
      auVar23 = vfmadd213ps_fma(auVar22,auVar39,auVar50);
      auVar22 = vrcpps_avx(auVar23);
      auVar23 = vfmsub213ps_fma(auVar23,auVar22,auVar50);
      auVar22 = vfnmadd132ps_fma(auVar23,auVar22,auVar22);
      *(undefined1 (*) [16])*pauVar18 = auVar22;
      pauVar18 = (undefined1 (*) [64])(*pauVar18 + 0x10);
    }
    for (; iVar19 < iVar17; iVar19 = iVar19 + 1) {
      fVar37 = expf(-*(float *)*pauVar18);
      *(float *)*pauVar18 = 1.0 / (fVar37 + 1.0);
      pauVar18 = (undefined1 (*) [64])(*pauVar18 + 4);
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}